

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LipidTransVisitor.cpp
# Opt level: O0

void __thiscall
OpenMD::LipidTransVisitor::LipidTransVisitor
          (LipidTransVisitor *this,SimInfo *info,string *originSeleScript,string *refSeleScript)

{
  undefined1 uVar1;
  int iVar2;
  StuntDouble *pSVar3;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  SimInfo *in_stack_00000008;
  SelectionEvaluator *in_stack_00000010;
  int i_1;
  int i;
  SimInfo *in_stack_000001b8;
  SelectionManager *in_stack_000001c0;
  SelectionSet *in_stack_ffffffffffffff18;
  SelectionSet *bs;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined8 local_c8;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  SelectionEvaluator *this_00;
  
  BaseVisitor::BaseVisitor((BaseVisitor *)0x34a6c9);
  *in_RDI = &PTR__LipidTransVisitor_00486198;
  in_RDI[5] = in_RSI;
  SelectionEvaluator::SelectionEvaluator(in_stack_00000010,in_stack_00000008);
  SelectionManager::SelectionManager(in_stack_000001c0,in_stack_000001b8);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000010,in_stack_00000008);
  SelectionManager::SelectionManager(in_stack_000001c0,in_stack_000001b8);
  in_RDI[0x18d] = 0;
  this_00 = (SelectionEvaluator *)(in_RDI + 0x18e);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x34a780);
  Vector3<double>::Vector3((Vector3<double> *)0x34a793);
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"LipidTransVisitor");
  SelectionEvaluator::loadScriptString
            (this_00,(string *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 6));
  if (!(bool)uVar1) {
    SelectionEvaluator::evaluate
              ((SelectionEvaluator *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    SelectionSet::~SelectionSet((SelectionSet *)0x34a82d);
    in_stack_ffffffffffffff4c = SelectionManager::getSelectionCount((SelectionManager *)0x34a83e);
    if (in_stack_ffffffffffffff4c == 1) {
      pSVar3 = SelectionManager::beginSelected
                         ((SelectionManager *)
                          CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                          (int *)in_stack_ffffffffffffff18);
      if (pSVar3 == (StuntDouble *)0x0) {
        local_c8 = 0;
      }
      else {
        local_c8 = __dynamic_cast(pSVar3,&StuntDouble::typeinfo,&DirectionalAtom::typeinfo,0);
      }
      in_RDI[0xc9] = local_c8;
      if (in_RDI[0xc9] == 0) {
        snprintf(painCave.errMsg,2000,
                 "LipidTransVisitor: origin selection must select an directional atom");
        painCave.isFatal = 1;
        simError();
      }
    }
    else {
      snprintf(painCave.errMsg,2000,
               "LipidTransVisitor: origin selection must select an directional atom");
      painCave.isFatal = 1;
      simError();
    }
  }
  SelectionEvaluator::loadScriptString(this_00,(string *)CONCAT17(uVar1,in_stack_ffffffffffffff58));
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xca));
  if (!(bool)uVar1) {
    bs = (SelectionSet *)(in_RDI + 0x174);
    SelectionEvaluator::evaluate
              ((SelectionEvaluator *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT17(uVar1,in_stack_ffffffffffffff20),bs);
    SelectionSet::~SelectionSet((SelectionSet *)0x34aa82);
    iVar2 = SelectionManager::getSelectionCount((SelectionManager *)0x34aa93);
    if (iVar2 == 1) {
      pSVar3 = SelectionManager::beginSelected
                         ((SelectionManager *)CONCAT17(uVar1,in_stack_ffffffffffffff20),(int *)bs);
      in_RDI[0x18d] = pSVar3;
    }
  }
  return;
}

Assistant:

LipidTransVisitor::LipidTransVisitor(SimInfo* info,
                                       const std::string& originSeleScript,
                                       const std::string& refSeleScript) :
      BaseVisitor(),
      info_(info), originEvaluator_(info), originSeleMan_(info),
      refEvaluator_(info), refSeleMan_(info), refSd_(NULL) {
    visitorName = "LipidTransVisitor";

    originEvaluator_.loadScriptString(originSeleScript);
    if (!originEvaluator_.isDynamic()) {
      originSeleMan_.setSelectionSet(originEvaluator_.evaluate());
      if (originSeleMan_.getSelectionCount() == 1) {
        int i;
        originDatom_ =
            dynamic_cast<DirectionalAtom*>(originSeleMan_.beginSelected(i));
        if (originDatom_ == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "LipidTransVisitor: origin selection must select an "
                   "directional atom");
          painCave.isFatal = 1;
          simError();
        }
      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "LipidTransVisitor: origin selection must select an directional "
            "atom");
        painCave.isFatal = 1;
        simError();
      }
    }

    refEvaluator_.loadScriptString(refSeleScript);
    if (!refEvaluator_.isDynamic()) {
      refSeleMan_.setSelectionSet(refEvaluator_.evaluate());
      if (refSeleMan_.getSelectionCount() == 1) {
        int i;
        refSd_ = refSeleMan_.beginSelected(i);

      } else {
        // error
      }
    }
  }